

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode_machine.hpp
# Opt level: O0

void __thiscall
randomx::BytecodeMachine::compileProgram
          (BytecodeMachine *this,Program *program,InstructionByteCode *bytecode,
          NativeRegisterFile *regFile)

{
  NativeRegisterFile *in_RCX;
  Program *in_RSI;
  BytecodeMachine *in_RDI;
  InstructionByteCode *ibc;
  Instruction *instr;
  uint i;
  InstructionByteCode *in_stack_000000a8;
  int in_stack_000000b4;
  Instruction *in_stack_000000b8;
  BytecodeMachine *in_stack_000000c0;
  undefined4 local_24;
  
  beginCompilation(in_RDI,in_RCX);
  for (local_24 = 0; local_24 < 0x100; local_24 = local_24 + 1) {
    Program::operator()(in_RSI,local_24);
    compileInstruction(in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000a8);
  }
  return;
}

Assistant:

void compileProgram(Program& program, InstructionByteCode bytecode[RANDOMX_PROGRAM_SIZE], NativeRegisterFile& regFile) {
			beginCompilation(regFile);
			for (unsigned i = 0; i < RANDOMX_PROGRAM_SIZE; ++i) {
				auto& instr = program(i);
				auto& ibc = bytecode[i];
				compileInstruction(instr, i, ibc);
			}
		}